

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O1

FlagRegistry * gflags::anon_unknown_2::FlagRegistry::GlobalRegistry(void)

{
  MutexType MVar1;
  _Rb_tree_header *p_Var2;
  bool bVar3;
  
  if ((anonymous_namespace)::FlagRegistry::GlobalRegistry()::lock == '\0') {
    _GLOBAL__N_1::FlagRegistry::GlobalRegistry();
  }
  MVar1 = GlobalRegistry::lock.mutex_;
  bVar3 = GlobalRegistry::lock.mutex_ == 0;
  GlobalRegistry::lock.mutex_ = GlobalRegistry::lock.mutex_ + -1;
  if (bVar3) {
    if ((anonymous_namespace)::FlagRegistry::global_registry_ == (FlagRegistry *)0x0) {
      (anonymous_namespace)::FlagRegistry::global_registry_ = (FlagRegistry *)operator_new(0x68);
      p_Var2 = &((anonymous_namespace)::FlagRegistry::global_registry_->flags_)._M_t._M_impl.
                super__Rb_tree_header;
      ((anonymous_namespace)::FlagRegistry::global_registry_->flags_)._M_t._M_impl.
      super__Rb_tree_header._M_header._M_color = _S_red;
      ((anonymous_namespace)::FlagRegistry::global_registry_->flags_)._M_t._M_impl.
      super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      ((anonymous_namespace)::FlagRegistry::global_registry_->flags_)._M_t._M_impl.
      super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
      ((anonymous_namespace)::FlagRegistry::global_registry_->flags_)._M_t._M_impl.
      super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
      ((anonymous_namespace)::FlagRegistry::global_registry_->flags_)._M_t._M_impl.
      super__Rb_tree_header._M_node_count = 0;
      p_Var2 = &((anonymous_namespace)::FlagRegistry::global_registry_->flags_by_ptr_)._M_t._M_impl.
                super__Rb_tree_header;
      ((anonymous_namespace)::FlagRegistry::global_registry_->flags_by_ptr_)._M_t._M_impl.
      super__Rb_tree_header._M_header._M_color = _S_red;
      ((anonymous_namespace)::FlagRegistry::global_registry_->flags_by_ptr_)._M_t._M_impl.
      super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      ((anonymous_namespace)::FlagRegistry::global_registry_->flags_by_ptr_)._M_t._M_impl.
      super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
      ((anonymous_namespace)::FlagRegistry::global_registry_->flags_by_ptr_)._M_t._M_impl.
      super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
      ((anonymous_namespace)::FlagRegistry::global_registry_->flags_by_ptr_)._M_t._M_impl.
      super__Rb_tree_header._M_node_count = 0;
      ((anonymous_namespace)::FlagRegistry::global_registry_->lock_).mutex_ = 0;
    }
    GlobalRegistry::lock.mutex_ = MVar1;
    return (anonymous_namespace)::FlagRegistry::global_registry_;
  }
  __assert_fail("--mutex_ == -1",
                "/workspace/llm4binary/github/license_c_cmakelists/jarulraj[P]sqlcheck/external/gflags/src/mutex.h"
                ,0xde,"void gflags_mutex_namespace::Mutex::Lock()");
}

Assistant:

FlagRegistry* FlagRegistry::GlobalRegistry() {
  static Mutex lock(Mutex::LINKER_INITIALIZED);
  MutexLock acquire_lock(&lock);
  if (!global_registry_) {
    global_registry_ = new FlagRegistry;
  }
  return global_registry_;
}